

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O2

bool __thiscall QPDFObjectHandle::isFormXObject(QPDFObjectHandle *this)

{
  bool bVar1;
  allocator<char> local_4a;
  allocator<char> local_49;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"",&local_49);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"/Form",&local_4a);
  bVar1 = isStreamOfType(this,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return bVar1;
}

Assistant:

bool
QPDFObjectHandle::isFormXObject() const
{
    return isStreamOfType("", "/Form");
}